

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscSim.c
# Opt level: O1

Vec_Int_t * Ssc_GiaGetOneSim(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  word *__ptr;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  word *pwVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  
  uVar9 = (long)p->vSimsPi->nSize / (long)(p->vCis->nSize - p->nRegs);
  __ptr = Ssc_GiaGetCareMask(p);
  uVar13 = 0xffffffff;
  if (0 < (int)uVar9) {
    lVar8 = 0;
    pwVar11 = __ptr;
    do {
      uVar3 = *pwVar11;
      if (uVar3 != 0) {
        bVar14 = (int)uVar3 == 0;
        uVar9 = uVar3 >> 0x20;
        if (!bVar14) {
          uVar9 = uVar3;
        }
        iVar10 = (uint)bVar14 * 0x20;
        iVar12 = iVar10 + 0x10;
        uVar3 = uVar9 >> 0x10;
        if ((short)uVar9 != 0) {
          iVar12 = iVar10;
          uVar3 = uVar9;
        }
        iVar10 = iVar12 + 8;
        uVar9 = uVar3 >> 8;
        if ((char)uVar3 != '\0') {
          iVar10 = iVar12;
          uVar9 = uVar3;
        }
        iVar12 = iVar10 + 4;
        uVar3 = uVar9 >> 4;
        if ((uVar9 & 0xf) != 0) {
          iVar12 = iVar10;
          uVar3 = uVar9;
        }
        uVar13 = (uint)(uVar3 >> 2) & 0x3fffffff;
        iVar10 = iVar12 + 2;
        if ((uVar3 & 3) != 0) {
          uVar13 = (uint)uVar3;
          iVar10 = iVar12;
        }
        uVar13 = ((~uVar13 & 1) + iVar10) - (int)lVar8;
        break;
      }
      lVar8 = lVar8 + -0x40;
      pwVar11 = pwVar11 + 1;
    } while ((uVar9 & 0xffffffff) * 0x40 + lVar8 != 0);
  }
  if (__ptr != (word *)0x0) {
    free(__ptr);
  }
  if (uVar13 == 0xffffffff) {
    pVVar5 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 100;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(400);
    pVVar5->pArray = piVar6;
    pVVar7 = p->vCis;
    uVar9 = (ulong)(uint)pVVar7->nSize;
    if (0 < pVVar7->nSize) {
      lVar8 = 0;
      do {
        iVar12 = pVVar7->pArray[lVar8];
        if ((iVar12 < 0) || (p->nObjs <= iVar12)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (p->pObjs == (Gia_Obj_t *)0x0) {
          return pVVar5;
        }
        uVar4 = (p->vSimsPi->nSize / ((int)uVar9 - p->nRegs)) * iVar12;
        if (((int)uVar4 < 0) || (p->vSims->nSize <= (int)uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                        ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        uVar4 = *(uint *)((long)p->vSims->pArray + (long)((int)uVar13 >> 5) * 4 + (ulong)uVar4 * 8);
        uVar1 = pVVar5->nSize;
        uVar2 = pVVar5->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar5->pArray == (int *)0x0) {
              piVar6 = (int *)malloc(0x40);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pArray,0x40);
            }
            pVVar5->pArray = piVar6;
            iVar12 = 0x10;
          }
          else {
            iVar12 = uVar2 * 2;
            if (iVar12 <= (int)uVar2) goto LAB_0063a9e2;
            if (pVVar5->pArray == (int *)0x0) {
              piVar6 = (int *)malloc((ulong)uVar2 << 3);
            }
            else {
              piVar6 = (int *)realloc(pVVar5->pArray,(ulong)uVar2 << 3);
            }
            pVVar5->pArray = piVar6;
          }
          if (piVar6 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar5->nCap = iVar12;
        }
LAB_0063a9e2:
        pVVar5->nSize = uVar1 + 1;
        pVVar5->pArray[(int)uVar1] = (uint)((uVar4 >> (uVar13 & 0x1f) & 1) != 0);
        lVar8 = lVar8 + 1;
        pVVar7 = p->vCis;
        uVar9 = (ulong)pVVar7->nSize;
      } while (lVar8 < (long)uVar9);
    }
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Ssc_GiaGetOneSim( Gia_Man_t * p )
{
    Vec_Int_t * vInit;
    Gia_Obj_t * pObj;
    int i, iBit, nWords = Gia_ObjSimWords( p );
    word * pRes = Ssc_GiaGetCareMask( p );
    iBit = Ssc_SimFindBit( pRes, nWords );
    ABC_FREE( pRes );
    if ( iBit == -1 )
        return NULL;
    vInit = Vec_IntAlloc( 100 );
    Gia_ManForEachCi( p, pObj, i )
        Vec_IntPush( vInit, Abc_InfoHasBit((unsigned *)Gia_ObjSimObj(p, pObj), iBit) );
    return vInit;
}